

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::DeletePropertyAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  ScriptContext *scriptContext;
  JsRTVarAndIntegralArgumentsAction_InternalUse<1UL,_2UL> *pJVar4;
  Var pvVar5;
  RecyclableObject *value;
  undefined4 *puVar6;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  pJVar4 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarAndIntegralArgumentsAction_InternalUse<1ul,2ul>,(TTD::NSLogEvents::EventKind)57>
                     (evt);
  pvVar5 = InflateVarInReplay(executeContext,pJVar4->VarArray[0]);
  if (pvVar5 != (Var)0x0) {
    BVar3 = Js::JavascriptOperators::IsObject(pvVar5);
    if (BVar3 != 0) {
      value = Js::VarTo<Js::RecyclableObject>(pvVar5);
      if ((((((value->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
          scriptContext.ptr != scriptContext) {
        pvVar5 = Js::CrossSite::MarshalVar(scriptContext,value,false);
      }
      pvVar5 = Js::JavascriptOperators::OP_DeleteProperty
                         (pvVar5,(PropertyId)pJVar4->ScalarArray[0],scriptContext,
                          (uint)(pJVar4->ScalarArray[1] != 0));
      if (pvVar5 != (Var)0x0) {
        BVar3 = Js::CrossSite::NeedMarshalVar(pvVar5,scriptContext);
        if (BVar3 != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTActionEvents.cpp"
                             ,0x2a9,"(res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx))",
                             "res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx)");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar6 = 0;
        }
      }
      JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTVarAndIntegralArgumentsAction_InternalUse<1ul,2ul>,(TTD::NSLogEvents::EventKind)57>
                (executeContext,evt,pvVar5);
      return;
    }
  }
  return;
}

Assistant:

void DeletePropertyAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTSingleVarDoubleScalarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarDoubleScalarArgumentAction, EventKind::DeletePropertyActionTag>(evt);
            Js::Var var = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT(var, ctx);

            Js::Var res = Js::JavascriptOperators::OP_DeleteProperty(var, GetPropertyIdItem(action), ctx, GetScalarItem_1(action) ? Js::PropertyOperation_StrictMode : Js::PropertyOperation_None);
            Assert(res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx));

            JsRTActionHandleResultForReplay<JsRTSingleVarDoubleScalarArgumentAction, EventKind::DeletePropertyActionTag>(executeContext, evt, res);
        }